

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O2

HRESULT Memory::HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::
        GenerateValidPointersMapForBlockType(PAL_FILE *file)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 *puVar5;
  ValidPointersMapRow *validTable;
  SmallHeapBlockBitVector *invalidTable;
  BlockInfoMapTable *blockInfoTable;
  long lVar6;
  ValidPointersMapRow *pauVar7;
  SmallHeapBlockBitVector *pSVar8;
  char16_t *pcVar9;
  uint j;
  long lVar10;
  uint uVar11;
  
  if (file == (PAL_FILE *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0xcc,"(file != nullptr)","file != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  validTable = (ValidPointersMapRow *)malloc(0xc000);
  invalidTable = (SmallHeapBlockBitVector *)malloc(0x600);
  blockInfoTable = (BlockInfoMapTable *)malloc(0xc0);
  uVar11 = 0x80004005;
  if (blockInfoTable == (BlockInfoMapTable *)0x0 ||
      (invalidTable == (SmallHeapBlockBitVector *)0x0 ||
      (ValidPointersMapTable *)validTable == (ValidPointersMapTable *)0x0)) goto LAB_0065527c;
  GenerateValidPointersMap
            ((ValidPointersMapTable *)validTable,(InvalidBitsTable *)invalidTable,blockInfoTable);
  iVar3 = PAL_fwprintf(file,L"#if USE_VPM_TABLE\n");
  if ((iVar3 < 0) ||
     (iVar3 = PAL_fwprintf(file,
                           L"const ushort HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::validPointersBuffer[HeapConstants::BucketCount][HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::rowSize] = \n{\n"
                          ), iVar3 < 0)) goto LAB_0065527c;
  lVar6 = 0;
  pauVar7 = validTable;
  while( true ) {
    if (lVar6 == 0x30) {
      iVar3 = PAL_fwprintf(file,L"};\n");
      uVar11 = 0x80004005;
      if (((iVar3 < 0) || (iVar3 = PAL_fwprintf(file,L"#endif // USE_VPM_TABLE\n\n"), iVar3 < 0)) ||
         (iVar3 = PAL_fwprintf(file,
                               L"const BVUnit HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::invalidBitsData[HeapConstants::BucketCount][SmallHeapBlockT<SmallAllocationBlockAttributes>::SmallHeapBlockBitVector::wordCount] = {\n"
                              ), iVar3 < 0)) goto LAB_0065527c;
      lVar6 = 0;
      pSVar8 = invalidTable;
      goto LAB_00655306;
    }
    iVar3 = PAL_fwprintf(file,L"    {\n        ");
    if (iVar3 < 0) break;
    lVar10 = -0x200;
    while (lVar10 != 0) {
      pcVar9 = L"0x%04hX, ";
      if (lVar10 + 1 == 0) {
        pcVar9 = L"0x%04hX";
      }
      iVar3 = PAL_fwprintf(file,pcVar9,(ulong)pauVar7[1][lVar10]);
      lVar10 = lVar10 + 1;
      if (iVar3 < 0) goto LAB_0065526e;
    }
    pcVar9 = L"\n    },\n";
    if (lVar6 == 0x2f) {
      pcVar9 = L"\n    }\n";
    }
    iVar3 = PAL_fwprintf(file,pcVar9);
    lVar6 = lVar6 + 1;
    pauVar7 = pauVar7 + 1;
    if (iVar3 < 0) break;
  }
  goto LAB_0065526e;
LAB_00655306:
  if (lVar6 == 0x30) {
    iVar3 = PAL_fwprintf(file,
                         L"};\n// The following is used to construct the InvalidBitsTable statically without forcing BVStatic to be an aggregate\nconst HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::InvalidBitsTable * const HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::invalidBitsBuffers =\n    reinterpret_cast<const HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::InvalidBitsTable *>(&HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::invalidBitsData);\n"
                        );
    if ((-1 < iVar3) &&
       (iVar3 = PAL_fwprintf(file,
                             L"const SmallHeapBlockT<SmallAllocationBlockAttributes>::BlockInfo  HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::blockInfoBuffer[SmallAllocationBlockAttributes::BucketCount][SmallAllocationBlockAttributes::PageCount] = {\n"
                            ), -1 < iVar3)) {
      iVar3 = 0x10;
      lVar6 = 0;
      goto LAB_006553ce;
    }
    goto LAB_0065526e;
  }
  iVar3 = PAL_fwprintf(file,L"    {\n        ");
  if (iVar3 < 0) goto LAB_0065526e;
  lVar10 = 0;
  while (lVar10 != 4) {
    pcVar9 = L"0x%016I64X, ";
    if (lVar10 == 3) {
      pcVar9 = L"0x%016I64X";
    }
    iVar3 = PAL_fwprintf(file,pcVar9,((SmallHeapBlockBitVector *)pSVar8->data)->data[lVar10].word);
    lVar10 = lVar10 + 1;
    if (iVar3 < 0) goto LAB_0065526e;
  }
  pcVar9 = L"\n    },\n";
  if (lVar6 == 0x2f) {
    pcVar9 = L"\n    }\n";
  }
  iVar3 = PAL_fwprintf(file,pcVar9);
  lVar6 = lVar6 + 1;
  pSVar8 = pSVar8 + 1;
  if (iVar3 < 0) goto LAB_0065526e;
  goto LAB_00655306;
  while( true ) {
    pcVar9 = L"\n    },\n";
    if (lVar6 == 0x2f) {
      pcVar9 = L"\n    }\n";
    }
    iVar4 = PAL_fwprintf(file,pcVar9 + 1);
    lVar6 = lVar6 + 1;
    iVar3 = iVar3 + 0x10;
    if (iVar4 < 0) break;
LAB_006553ce:
    if (lVar6 == 0x30) {
      iVar3 = PAL_fwprintf(file,L"};\n");
      uVar11 = iVar3 >> 0x1f & 0x80004005;
      goto LAB_0065527c;
    }
    iVar4 = PAL_fwprintf(file,L"    // Bucket: %u, Size: %d\n",lVar6,iVar3);
    if (((iVar4 < 0) || (iVar4 = PAL_fwprintf(file,L"    {\n"), iVar4 < 0)) ||
       ((iVar4 = PAL_fwprintf(file,L"        { "), iVar4 < 0 ||
        ((iVar4 = PAL_fwprintf(file,L"0x%04hX, 0x%04hX",
                               (ulong)(*blockInfoTable)[lVar6][0].lastObjectIndexOnPage,
                               (ulong)(*blockInfoTable)[lVar6][0].pageObjectCount), iVar4 < 0 ||
         (iVar4 = PAL_fwprintf(file,L" }\n"), iVar4 < 0)))))) break;
  }
LAB_0065526e:
  uVar11 = 0x80004005;
LAB_0065527c:
  free(validTable);
  free(invalidTable);
  return uVar11;
}

Assistant:

HRESULT HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::GenerateValidPointersMapForBlockType(FILE* file)
{
#define IfErrorGotoCleanup(result) if ((result) < 0) { hr = E_FAIL; goto cleanup; }

    Assert(file != nullptr);
    HRESULT hr = S_OK;

    // Use heap to allocate the table so we don't bloat the stack (~64k). We only use this function
    // to generate headers as part of testing.
    ValidPointersMapTable *valid = (ValidPointersMapTable *)malloc(sizeof(ValidPointersMapTable));
    InvalidBitsTable *invalid = (InvalidBitsTable *)malloc(sizeof(InvalidBitsTable));
    BlockInfoMapTable *blockMap = (BlockInfoMapTable*)malloc(sizeof(BlockInfoMapTable));

    if (valid == nullptr || invalid == nullptr || blockMap == nullptr)
    {
        hr = E_FAIL;
        goto cleanup;
    }
    GenerateValidPointersMap(valid, *invalid, *blockMap);

    IfErrorGotoCleanup(fwprintf(file, _u("#if USE_VPM_TABLE\n")))
    IfErrorGotoCleanup(fwprintf(file, _u("const ushort HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::validPointersBuffer[HeapConstants::BucketCount][HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::rowSize] = \n{\n")));
    // Generate the full buffer.
    for (unsigned i = 0; i < HeapConstants::BucketCount; ++i)
    {
        IfErrorGotoCleanup(fwprintf(file, _u("    {\n        ")));
        for (unsigned j = 0; j < rowSize; ++j)
        {
            IfErrorGotoCleanup(fwprintf(
                file,
                (j < rowSize - 1) ? _u("0x%04hX, ") : _u("0x%04hX"),
                (*valid)[i][j]));
        }
        IfErrorGotoCleanup(fwprintf(file, (i < HeapConstants::BucketCount - 1 ? _u("\n    },\n") : _u("\n    }\n"))));
    }
    IfErrorGotoCleanup(fwprintf(file, _u("};\n")));
    IfErrorGotoCleanup(fwprintf(file, _u("#endif // USE_VPM_TABLE\n\n")))

    // Generate the invalid bitvectors.
    IfErrorGotoCleanup(fwprintf(
        file,
        _u("const BVUnit HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::invalidBitsData[HeapConstants::BucketCount][SmallHeapBlockT<SmallAllocationBlockAttributes>::SmallHeapBlockBitVector::wordCount] = {\n")));
    for (unsigned i = 0; i < HeapConstants::BucketCount; ++i)
    {
        IfErrorGotoCleanup(fwprintf(file, _u("    {\n        ")));

        for (unsigned j = 0; j < (*invalid)[i].wordCount; ++j)
        {
            const char16 *format = (j < (*invalid)[i].wordCount - 1) ?
#if defined(TARGET_32)
                _u("0x%08X, ") : _u("0x%08X")
#elif defined(TARGET_64)
                _u("0x%016I64X, ") : _u("0x%016I64X")
#else
#error "Platform is not handled"
#endif
                ;
            IfErrorGotoCleanup(fwprintf(file, format, (*invalid)[i].GetRawData()[j]));
        }
        IfErrorGotoCleanup(fwprintf(file, (i < HeapConstants::BucketCount - 1 ? _u("\n    },\n") : _u("\n    }\n"))));
    }

    IfErrorGotoCleanup(fwprintf(
        file,
        _u("};\n")
        _u("// The following is used to construct the InvalidBitsTable statically without forcing BVStatic to be an aggregate\n")
        _u("const HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::InvalidBitsTable * const HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::invalidBitsBuffers =\n")
        _u("    reinterpret_cast<const HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::InvalidBitsTable *>(&HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::invalidBitsData);\n")));

    // Generate the block map table
    IfErrorGotoCleanup(fwprintf(
        file,
        _u("const SmallHeapBlockT<SmallAllocationBlockAttributes>::BlockInfo  HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::blockInfoBuffer[SmallAllocationBlockAttributes::BucketCount][SmallAllocationBlockAttributes::PageCount] = {\n")));
    for (unsigned i = 0; i < HeapConstants::BucketCount; ++i)
    {
        IfErrorGotoCleanup(fwprintf(file, _u("    // Bucket: %u, Size: %d\n"), i, (int) (HeapConstants::ObjectGranularity + (i * SmallAllocationBlockAttributes::BucketGranularity))));
        IfErrorGotoCleanup(fwprintf(file, _u("    {\n")));

        for (unsigned j = 0; j < SmallAllocationBlockAttributes::PageCount; ++j)
        {
            IfErrorGotoCleanup(fwprintf(file, _u("        { ")));

            const char16 *format = _u("0x%04hX, 0x%04hX");
            IfErrorGotoCleanup(fwprintf(file, format, (*blockMap)[i][j].lastObjectIndexOnPage, (*blockMap)[i][j].pageObjectCount));
#if USE_FEWER_PAGES_PER_BLOCK
            IfErrorGotoCleanup(fwprintf(file, _u(" }\n")));
#else
            IfErrorGotoCleanup(fwprintf(file, (j < SmallAllocationBlockAttributes::PageCount - 1 ? _u(" },\n") : _u(" }\n"))));
#endif
        }
        IfErrorGotoCleanup(fwprintf(file, (i < HeapConstants::BucketCount - 1 ? _u("    },\n") : _u("    }\n"))));
    }

    IfErrorGotoCleanup(fwprintf(file, _u("};\n")));

cleanup:
#undef IfErrorGotoCleanup
    free(valid);
    free(invalid);
    return hr;
}